

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::writeHPageOffset(QPDF *this,BitWriter *w)

{
  HPageOffset *pHVar1;
  pointer pMVar2;
  unsigned_long_long uVar3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *entries;
  int local_24;
  HPageOffset *pHStack_20;
  int nitems;
  HPageOffset *t;
  BitWriter *w_local;
  QPDF *this_local;
  
  t = (HPageOffset *)w;
  w_local = (BitWriter *)this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pHStack_20 = &pMVar2->page_offset_hints;
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->min_nobjects,0x20);
  pHVar1 = t;
  uVar3 = toULL<long_long>(&pHStack_20->first_page_offset);
  BitWriter::writeBits((BitWriter *)pHVar1,uVar3,0x20);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_delta_nobjects,0x10);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->min_page_length,0x20);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_delta_page_length,0x10);
  pHVar1 = t;
  uVar3 = toULL<int>(&pHStack_20->min_content_offset);
  BitWriter::writeBits((BitWriter *)pHVar1,uVar3,0x20);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_delta_content_offset,0x10);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->min_content_length,0x20);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_delta_content_length,0x10);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_nshared_objects,0x10);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_shared_identifier,0x10);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_shared_numerator,0x10);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->shared_denominator,0x10);
  this_00 = getAllPages(this);
  entries = (vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(this_00);
  local_24 = toI<unsigned_long>((unsigned_long *)&entries);
  vec = &pHStack_20->entries;
  write_vector_int<QPDF::HPageOffsetEntry,int>
            ((BitWriter *)t,local_24,vec,pHStack_20->nbits_delta_nobjects,0);
  write_vector_int<QPDF::HPageOffsetEntry,long_long>
            ((BitWriter *)t,local_24,vec,pHStack_20->nbits_delta_page_length,8);
  write_vector_int<QPDF::HPageOffsetEntry,int>
            ((BitWriter *)t,local_24,vec,pHStack_20->nbits_nshared_objects,0x10);
  write_vector_vector<QPDF::HPageOffsetEntry>
            ((BitWriter *)t,local_24,vec,0x10,pHStack_20->nbits_shared_identifier,0x18);
  write_vector_vector<QPDF::HPageOffsetEntry>
            ((BitWriter *)t,local_24,vec,0x10,pHStack_20->nbits_shared_numerator,0x30);
  write_vector_int<QPDF::HPageOffsetEntry,long_long>
            ((BitWriter *)t,local_24,vec,pHStack_20->nbits_delta_content_offset,0x48);
  write_vector_int<QPDF::HPageOffsetEntry,long_long>
            ((BitWriter *)t,local_24,vec,pHStack_20->nbits_delta_content_length,0x50);
  return;
}

Assistant:

void
QPDF::writeHPageOffset(BitWriter& w)
{
    HPageOffset& t = m->page_offset_hints;

    w.writeBitsInt(t.min_nobjects, 32);               // 1
    w.writeBits(toULL(t.first_page_offset), 32);      // 2
    w.writeBitsInt(t.nbits_delta_nobjects, 16);       // 3
    w.writeBitsInt(t.min_page_length, 32);            // 4
    w.writeBitsInt(t.nbits_delta_page_length, 16);    // 5
    w.writeBits(toULL(t.min_content_offset), 32);     // 6
    w.writeBitsInt(t.nbits_delta_content_offset, 16); // 7
    w.writeBitsInt(t.min_content_length, 32);         // 8
    w.writeBitsInt(t.nbits_delta_content_length, 16); // 9
    w.writeBitsInt(t.nbits_nshared_objects, 16);      // 10
    w.writeBitsInt(t.nbits_shared_identifier, 16);    // 11
    w.writeBitsInt(t.nbits_shared_numerator, 16);     // 12
    w.writeBitsInt(t.shared_denominator, 16);         // 13

    int nitems = toI(getAllPages().size());
    std::vector<HPageOffsetEntry>& entries = t.entries;

    write_vector_int(w, nitems, entries, t.nbits_delta_nobjects, &HPageOffsetEntry::delta_nobjects);
    write_vector_int(
        w, nitems, entries, t.nbits_delta_page_length, &HPageOffsetEntry::delta_page_length);
    write_vector_int(
        w, nitems, entries, t.nbits_nshared_objects, &HPageOffsetEntry::nshared_objects);
    write_vector_vector(
        w,
        nitems,
        entries,
        &HPageOffsetEntry::nshared_objects,
        t.nbits_shared_identifier,
        &HPageOffsetEntry::shared_identifiers);
    write_vector_vector(
        w,
        nitems,
        entries,
        &HPageOffsetEntry::nshared_objects,
        t.nbits_shared_numerator,
        &HPageOffsetEntry::shared_numerators);
    write_vector_int(
        w, nitems, entries, t.nbits_delta_content_offset, &HPageOffsetEntry::delta_content_offset);
    write_vector_int(
        w, nitems, entries, t.nbits_delta_content_length, &HPageOffsetEntry::delta_content_length);
}